

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.cpp
# Opt level: O2

Ray * __thiscall Area::sample(Ray *__return_storage_ptr__,Area *this)

{
  int iVar1;
  unsigned_long __res;
  Ray *ray;
  Area *pAVar2;
  result_type_conflict f;
  result_type_conflict f_00;
  Vector3f local_b0;
  Vector3f local_a4;
  default_random_engine generator;
  uniform_real_distribution<float> sideTwoDist;
  uniform_real_distribution<float> sideOneDist;
  Hit cosineWeightedHit;
  Hit local_60;
  Vector3f source;
  
  pAVar2 = this;
  iVar1 = rand();
  generator._M_x = (ulong)(long)iVar1 % 0x7fffffff + (ulong)((ulong)(long)iVar1 % 0x7fffffff == 0);
  iVar1 = (int)pAVar2;
  Vector3f::abs(&this->_sideOne,iVar1);
  sideOneDist._M_param._M_a = 0.0;
  Vector3f::abs(&this->_sideTwo,iVar1);
  sideTwoDist._M_param._M_a = 0.0;
  f = std::uniform_real_distribution<float>::operator()(&sideOneDist,&generator);
  f_00 = std::uniform_real_distribution<float>::operator()(&sideTwoDist,&generator);
  Vector3f::normalized(&this->_sideOne);
  ::operator*(f,(Vector3f *)&local_60);
  operator+(&this->_corner,(Vector3f *)&local_60);
  Vector3f::normalized(&this->_sideTwo);
  ::operator*(f_00,&local_b0);
  operator+((Vector3f *)&cosineWeightedHit,&local_b0);
  Hit::Hit(&cosineWeightedHit);
  cosineWeightedHit.material = (this->super_Object3D).material;
  cosineWeightedHit.t = 0.0;
  Vector3f::operator=(&cosineWeightedHit.normal,&this->_normal);
  ray = (Ray *)operator_new(8);
  *(undefined ***)(ray->_origin).m_elements = &PTR__Sampler_0013abf0;
  Ray::Ray((Ray *)&local_60,&source,&this->_normal);
  cosineWeightedHemisphere::sample((cosineWeightedHemisphere *)&local_b0,ray,&local_60);
  Vector3f::normalized(&local_b0);
  Ray::Ray(__return_storage_ptr__,&source,&local_a4);
  return __return_storage_ptr__;
}

Assistant:

const Ray Area::sample() {
    // First, select a random point on the area.
    // Create generators for the sampling and get random lengths.
    std::default_random_engine generator(rand());
    std::uniform_real_distribution<float> sideOneDist(0., _sideOne.abs());
    std::uniform_real_distribution<float> sideTwoDist(0., _sideTwo.abs());
    float sideOneScale = sideOneDist(generator);
    float sideTwoScale = sideTwoDist(generator);

    // Fetch the random point and use a cosine weighted sampler (first two args don't matter).
    Vector3f source = _corner + sideOneScale * _sideOne.normalized() + sideTwoScale * _sideTwo.normalized();
    Hit cosineWeightedHit;
    cosineWeightedHit.set(0, this->material, _normal);
    Sampler *sampler = new cosineWeightedHemisphere;
    return Ray(source, sampler->sample(Ray(source, _normal), cosineWeightedHit).normalized());
}